

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<float> * __thiscall
Imath_2_5::Matrix33<float>::gjInverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  ulong uVar1;
  uint uVar2;
  float (*pafVar3) [3];
  SingMatrixExc *this_00;
  float (*pafVar4) [3];
  float (*pafVar5) [3];
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float (*pafVar10) [3];
  float (*pafVar11) [3];
  long lVar12;
  float (*pafVar13) [3];
  float (*pafVar14) [3];
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Matrix33<float> t;
  Matrix33<float> s;
  
  pafVar3 = (float (*) [3])&s;
  s.x[1][2] = 0.0;
  s.x[2][0] = 0.0;
  s.x[2][1] = 0.0;
  s.x[0][1] = 0.0;
  s.x[0][2] = 0.0;
  s.x[1][0] = 0.0;
  s.x[0][0] = 1.0;
  s.x[1][1] = 1.0;
  s.x[2][2] = 1.0;
  pafVar4 = t.x + 1;
  t.x[2][2] = this->x[2][2];
  t.x[1]._4_8_ = *(undefined8 *)(this->x[1] + 1);
  t.x[2]._0_8_ = *(undefined8 *)this->x[2];
  t.x[0]._0_8_ = *(undefined8 *)this->x[0];
  t.x._8_8_ = *(undefined8 *)(this->x[0] + 2);
  uVar8 = 1;
  lVar9 = 0x18;
  pafVar10 = (float (*) [3])&t;
  pafVar5 = s.x;
  uVar15 = 0;
  pafVar11 = pafVar4;
  while (pafVar5 = pafVar5 + 1, uVar15 != 2) {
    fVar18 = *(float *)((long)t.x + uVar15 * 0x10);
    fVar17 = -fVar18;
    if (-fVar18 <= fVar18) {
      fVar17 = fVar18;
    }
    uVar16 = uVar8 & 0xffffffff;
    uVar7 = uVar15 & 0xffffffff;
    for (lVar12 = 0; lVar9 != lVar12; lVar12 = lVar12 + 0xc) {
      fVar18 = *(float *)((long)*pafVar11 + lVar12);
      fVar19 = -fVar18;
      if (-fVar18 <= fVar18) {
        fVar19 = fVar18;
      }
      uVar1 = uVar16;
      if (fVar19 <= fVar17) {
        fVar19 = fVar17;
        uVar1 = uVar7;
      }
      uVar7 = uVar1;
      fVar17 = fVar19;
      uVar16 = (ulong)((int)uVar16 + 1);
    }
    if ((fVar17 == 0.0) && (!NAN(fVar17))) goto LAB_00124899;
    iVar6 = (int)uVar7;
    if (uVar15 != uVar7) {
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        fVar18 = (*pafVar10)[lVar12];
        (*pafVar10)[lVar12] = t.x[iVar6][lVar12];
        t.x[iVar6][lVar12] = fVar18;
        fVar18 = (*pafVar3)[lVar12];
        (*pafVar3)[lVar12] = s.x[iVar6][lVar12];
        s.x[iVar6][lVar12] = fVar18;
      }
    }
    pafVar13 = pafVar4;
    pafVar14 = pafVar5;
    for (uVar7 = uVar8; uVar7 != 3; uVar7 = uVar7 + 1) {
      fVar18 = -t.x[uVar7][uVar15] / *(float *)((long)t.x + uVar15 * 0x10);
      for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 4) {
        *(float *)((long)*pafVar13 + lVar12) =
             *(float *)((long)*(float (*) [3])*pafVar10 + lVar12) * fVar18 +
             *(float *)((long)*pafVar13 + lVar12);
        *(float *)((long)*pafVar14 + lVar12) =
             *(float *)((long)*(float (*) [3])*pafVar3 + lVar12) * fVar18 +
             *(float *)((long)*pafVar14 + lVar12);
      }
      pafVar14 = pafVar14 + 1;
      pafVar13 = pafVar13 + 1;
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + -0xc;
    pafVar11 = (float (*) [3])(pafVar11[1] + 1);
    pafVar3 = pafVar3 + 1;
    pafVar10 = pafVar10 + 1;
    pafVar4 = pafVar4 + 1;
    uVar15 = uVar15 + 1;
  }
  uVar2 = 2;
  while( true ) {
    if ((int)uVar2 < 0) {
      __return_storage_ptr__->x[2][2] = s.x[2][2];
      *(ulong *)(__return_storage_ptr__->x[1] + 1) = CONCAT44(s.x[1][2],s.x[1][1]);
      *(undefined8 *)__return_storage_ptr__->x[2] = s.x[2]._0_8_;
      *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(s.x[0][1],s.x[0][0]);
      *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(s.x[1][0],s.x[0][2]);
      return __return_storage_ptr__;
    }
    uVar8 = (ulong)uVar2;
    fVar18 = *(float *)((long)t.x + uVar8 * 0x10);
    if ((fVar18 == 0.0) && (!NAN(fVar18))) break;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      t.x[uVar8][lVar9] = t.x[uVar8][lVar9] / fVar18;
      s.x[uVar8][lVar9] = s.x[uVar8][lVar9] / fVar18;
    }
    pafVar3 = (float (*) [3])&s;
    pafVar4 = (float (*) [3])&t;
    for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
      fVar18 = -t.x[uVar15][uVar8];
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        (*(float (*) [3])*pafVar4)[lVar9] =
             t.x[uVar8][lVar9] * fVar18 + (*(float (*) [3])*pafVar4)[lVar9];
        (*(float (*) [3])*pafVar3)[lVar9] =
             s.x[uVar8][lVar9] * fVar18 + (*(float (*) [3])*pafVar3)[lVar9];
      }
      pafVar3 = pafVar3 + 1;
      pafVar4 = pafVar4 + 1;
    }
    uVar2 = uVar2 - 1;
  }
LAB_00124899:
  if (!singExc) {
    *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    return __return_storage_ptr__;
  }
  this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
  Imath_2_5::SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
  __cxa_throw(this_00,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
}

Assistant:

Matrix33<T>
Matrix33<T>::gjInverse (bool singExc) const
{
    int i, j, k;
    Matrix33 s;
    Matrix33 t (*this);

    // Forward elimination

    for (i = 0; i < 2 ; i++)
    {
        int pivot = i;

        T pivotsize = t[i][i];

        if (pivotsize < 0)
            pivotsize = -pivotsize;

        for (j = i + 1; j < 3; j++)
        {
            T tmp = t[j][i];

            if (tmp < 0)
                tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix33();
        }

        if (pivot != i)
        {
            for (j = 0; j < 3; j++)
            {
                T tmp;

                tmp = t[i][j];
                t[i][j] = t[pivot][j];
                t[pivot][j] = tmp;

                tmp = s[i][j];
                s[i][j] = s[pivot][j];
                s[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 3; j++)
        {
            T f = t[j][i] / t[i][i];

            for (k = 0; k < 3; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 2; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix33();
        }

        for (j = 0; j < 3; j++)
        {
            t[i][j] /= f;
            s[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t[j][i];

            for (k = 0; k < 3; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    return s;
}